

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueCollector.h
# Opt level: O1

void __thiscall
CliqueCollector::add
          (CliqueCollector *this,unique_ptr<Clique,_std::default_delete<Clique>_> *clique,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *appearanceMap)

{
  uint uVar1;
  _func_int *p_Var2;
  LogWriter *this_00;
  CliqueFinder *pCVar3;
  _List_node_base *p_Var4;
  deque<AlignmentRecord*,std::allocator<AlignmentRecord*>> *this_01;
  undefined8 uVar5;
  alignment_id_t aVar6;
  _List_node_base *p_Var7;
  AlignmentRecord *pAVar8;
  AlignmentRecord **a;
  _func_int *p_Var9;
  unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
  alignments;
  AlignmentRecord *al;
  undefined1 local_70 [16];
  _List_node_base *local_60;
  size_t local_58;
  alignment_set_t *local_50;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Clique::getAllAlignments((Clique *)local_70);
  if (this->lw != (LogWriter *)0x0) {
    local_70._8_8_ = local_70 + 8;
    local_58 = 0;
    p_Var2 = ((_func_int **)local_70._0_8_)[1];
    local_60 = (_List_node_base *)local_70._8_8_;
    local_50 = (alignment_set_t *)appearanceMap;
    for (p_Var9 = *(_func_int **)local_70._0_8_; p_Var9 != p_Var2; p_Var9 = p_Var9 + 8) {
      aVar6 = AlignmentRecord::getID(*(AlignmentRecord **)p_Var9);
      p_Var7 = (_List_node_base *)operator_new(0x18);
      *(alignment_id_t *)&p_Var7[1]._M_next = aVar6;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      local_58 = local_58 + 1;
    }
    this_00 = this->lw;
    uVar1 = this->id;
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              (&local_48,(list<unsigned_int,_std::allocator<unsigned_int>_> *)(local_70 + 8));
    LogWriter::reportClique(this_00,uVar1,&local_48);
    while (appearanceMap =
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_50, p_Var7 = (_List_node_base *)local_70._8_8_,
          (CliqueFinder *)
          local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (CliqueFinder *)&local_48) {
      pCVar3 = (CliqueFinder *)
               (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                &((CliqueFinder *)
                 local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 _M_node.super__List_node_base._M_next)->_vptr_CliqueFinder)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      ._M_node.super__List_node_base._M_next);
      local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)pCVar3;
    }
    while (local_50 = (alignment_set_t *)appearanceMap, p_Var7 != (_List_node_base *)(local_70 + 8))
    {
      p_Var4 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var7->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var7);
      appearanceMap =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_50;
      p_Var7 = p_Var4;
    }
  }
  uVar5 = local_70._0_8_;
  if ((ulong)((long)*(_func_int **)(local_70._0_8_ + 8) - (long)*(_func_int **)local_70._0_8_) < 9)
  {
    pAVar8 = (AlignmentRecord *)operator_new(0x318);
    AlignmentRecord::AlignmentRecord(pAVar8,*(AlignmentRecord **)*(_func_int **)uVar5);
    this->id = this->id + 1;
    local_70._8_8_ = pAVar8;
  }
  else {
    pAVar8 = (AlignmentRecord *)operator_new(0x318);
    uVar1 = this->id;
    this->id = uVar1 + 1;
    AlignmentRecord::AlignmentRecord
              (pAVar8,(unique_ptr<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
                       *)local_70,uVar1,appearanceMap);
    local_70._8_8_ = pAVar8;
  }
  this_01 = (deque<AlignmentRecord*,std::allocator<AlignmentRecord*>> *)this->superReads;
  if (*(undefined8 **)(this_01 + 0x30) == (undefined8 *)(*(long *)(this_01 + 0x40) + -8)) {
    std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>::
    _M_push_back_aux<AlignmentRecord*const&>(this_01,(AlignmentRecord **)(local_70 + 8));
  }
  else {
    **(undefined8 **)(this_01 + 0x30) = local_70._8_8_;
    *(long *)(this_01 + 0x30) = *(long *)(this_01 + 0x30) + 8;
  }
  if ((tuple<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_*,_std::default_delete<std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_>_>
       )local_70._0_8_ !=
      (_Head_base<0UL,_std::vector<const_AlignmentRecord_*,_std::allocator<const_AlignmentRecord_*>_>_*,_false>
       )0x0) {
    if (*(_func_int **)local_70._0_8_ != (_func_int *)0x0) {
      operator_delete(*(_func_int **)local_70._0_8_);
    }
    operator_delete((void *)local_70._0_8_);
  }
  return;
}

Assistant:

void add(std::unique_ptr<Clique> clique,std::map<std::string,int>* appearanceMap) {
        assert(clique.get() != nullptr);

//        std::cerr << "Clique " << id << std::endl;
        std::unique_ptr<std::vector<const AlignmentRecord*>> alignments = clique->getAllAlignments();

        if (lw != nullptr) {
            std::list<unsigned int> cll;            
            for (const auto& a : *alignments) {
                cll.push_back(a->getID());
            }
            lw->reportClique(this->id, cll);
        }

        AlignmentRecord* al;

        if (alignments->size() > 1) {
            al = new AlignmentRecord(alignments, this->id++,appearanceMap);
        } else {
            al = new AlignmentRecord(*(alignments->front()));
            this->id++;
        }

        superReads->push_back(al);
    }